

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp.c
# Opt level: O3

int uv_udp_set_source_membership
              (uv_udp_t *handle,char *multicast_addr,char *interface_addr,char *source_addr,
              uv_membership membership)

{
  int iVar1;
  int *piVar2;
  uint32_t uVar3;
  uv__sockaddr src_addr;
  uv__sockaddr mcast_addr;
  sockaddr_in6 local_18c;
  sockaddr_in6 local_170;
  sockaddr_in6 local_154;
  sockaddr local_138;
  undefined4 uStack_128;
  undefined4 uStack_124;
  undefined4 uStack_120;
  undefined8 uStack_11c;
  undefined8 uStack_9c;
  
  iVar1 = uv_ip4_addr(multicast_addr,0,(sockaddr_in *)&local_170);
  if (iVar1 == 0) {
    iVar1 = uv_ip4_addr(source_addr,0,(sockaddr_in *)&local_18c);
    if (iVar1 != 0) {
      return iVar1;
    }
    if ((handle->io_watcher).fd == -1) {
      local_138.sa_data[6] = '\0';
      local_138.sa_data[7] = '\0';
      local_138.sa_data[8] = '\0';
      local_138.sa_data[9] = '\0';
      local_138.sa_data[10] = '\0';
      local_138.sa_data[0xb] = '\0';
      local_138.sa_data[0xc] = '\0';
      local_138.sa_data[0xd] = '\0';
      local_138.sa_family = 2;
      local_138.sa_data[0] = '\0';
      local_138.sa_data[1] = '\0';
      local_138.sa_data[2] = '\0';
      local_138.sa_data[3] = '\0';
      local_138.sa_data[4] = '\0';
      local_138.sa_data[5] = '\0';
      iVar1 = uv__udp_bind(handle,&local_138,0x10,4);
      if (iVar1 != 0) {
        return iVar1;
      }
    }
    local_138.sa_data[6] = '\0';
    local_138.sa_data[7] = '\0';
    local_138.sa_data[8] = '\0';
    local_138.sa_data[9] = '\0';
    local_138.sa_family = 0;
    local_138.sa_data[0] = '\0';
    local_138.sa_data[1] = '\0';
    local_138.sa_data[2] = '\0';
    local_138.sa_data[3] = '\0';
    local_138.sa_data[4] = '\0';
    local_138.sa_data[5] = '\0';
    if ((interface_addr != (char *)0x0) &&
       (iVar1 = uv_inet_pton(2,interface_addr,local_138.sa_data + 2), iVar1 != 0)) {
      return iVar1;
    }
    local_138._0_4_ = local_170.sin6_flowinfo;
    local_138.sa_data[6] = (undefined1)local_18c.sin6_flowinfo;
    local_138.sa_data[7] = local_18c.sin6_flowinfo._1_1_;
    local_138.sa_data[8] = local_18c.sin6_flowinfo._2_1_;
    local_138.sa_data[9] = local_18c.sin6_flowinfo._3_1_;
    if (membership == UV_JOIN_GROUP) {
      iVar1 = 0x27;
    }
    else {
      if (membership != UV_LEAVE_GROUP) {
        return -0x16;
      }
      iVar1 = 0x28;
    }
    iVar1 = setsockopt((handle->io_watcher).fd,0,iVar1,&local_138,0xc);
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    iVar1 = uv_ip6_addr(multicast_addr,0,&local_170);
    if (iVar1 != 0) {
      return iVar1;
    }
    iVar1 = uv_ip6_addr(source_addr,0,&local_18c);
    if (iVar1 != 0) {
      return iVar1;
    }
    if ((handle->io_watcher).fd == -1) {
      uStack_120 = 0;
      local_138.sa_family = 10;
      local_138.sa_data[0] = '\0';
      local_138.sa_data[1] = '\0';
      local_138.sa_data[2] = '\0';
      local_138.sa_data[3] = '\0';
      local_138.sa_data[4] = '\0';
      local_138.sa_data[5] = '\0';
      local_138.sa_data._6_4_ = SUB84(_in6addr_any,0);
      local_138.sa_data._10_4_ = SUB84((ulong)_in6addr_any >> 0x20,0);
      uStack_128 = (undefined4)__Rb_tree_increment;
      uStack_124 = (undefined4)((ulong)__Rb_tree_increment >> 0x20);
      iVar1 = uv__udp_bind(handle,&local_138,0x1c,4);
      if (iVar1 != 0) {
        return iVar1;
      }
    }
    memset(&local_138,0,0x108);
    uVar3 = 0;
    if ((interface_addr != (char *)0x0) &&
       (iVar1 = uv_ip6_addr(interface_addr,0,&local_154), uVar3 = local_154.sin6_scope_id,
       iVar1 != 0)) {
      return iVar1;
    }
    local_138._0_4_ = uVar3;
    local_138.sa_data._6_4_ = local_170._0_4_;
    local_138.sa_data[10] = (undefined1)local_170.sin6_flowinfo;
    local_138.sa_data[0xb] = local_170.sin6_flowinfo._1_1_;
    local_138.sa_data[0xc] = local_170.sin6_flowinfo._2_1_;
    local_138.sa_data[0xd] = local_170.sin6_flowinfo._3_1_;
    uStack_11c = local_170._20_8_;
    uStack_9c = local_18c._20_8_;
    if (membership == UV_JOIN_GROUP) {
      iVar1 = 0x2e;
    }
    else {
      if (membership != UV_LEAVE_GROUP) {
        return -0x16;
      }
      iVar1 = 0x2f;
    }
    iVar1 = setsockopt((handle->io_watcher).fd,0x29,iVar1,&local_138,0x108);
    if (iVar1 == 0) {
      return 0;
    }
  }
  piVar2 = __errno_location();
  return -*piVar2;
}

Assistant:

int uv_udp_set_source_membership(uv_udp_t* handle,
                                 const char* multicast_addr,
                                 const char* interface_addr,
                                 const char* source_addr,
                                 uv_membership membership) {
#if !defined(__OpenBSD__) &&                                        \
    !defined(__NetBSD__) &&                                         \
    !defined(__ANDROID__) &&                                        \
    !defined(__DragonFly__) &&                                      \
    !defined(__QNX__) &&                                            \
    !defined(__GNU__)
  int err;
  union uv__sockaddr mcast_addr;
  union uv__sockaddr src_addr;

  err = uv_ip4_addr(multicast_addr, 0, &mcast_addr.in);
  if (err) {
    err = uv_ip6_addr(multicast_addr, 0, &mcast_addr.in6);
    if (err)
      return err;
    err = uv_ip6_addr(source_addr, 0, &src_addr.in6);
    if (err)
      return err;
    return uv__udp_set_source_membership6(handle,
                                          &mcast_addr.in6,
                                          interface_addr,
                                          &src_addr.in6,
                                          membership);
  }

  err = uv_ip4_addr(source_addr, 0, &src_addr.in);
  if (err)
    return err;
  return uv__udp_set_source_membership4(handle,
                                        &mcast_addr.in,
                                        interface_addr,
                                        &src_addr.in,
                                        membership);
#else
  return UV_ENOSYS;
#endif
}